

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

int google::protobuf::compiler::cpp::EstimateSize(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  bool local_3d;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  if (field == (FieldDescriptor *)0x0) {
    field_local._4_4_ = 0;
  }
  else {
    local_18 = field;
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_map(local_18);
      if (bVar1) {
        field_local._4_4_ = 0x20;
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(local_18);
        local_3d = true;
        if (8 < (int)CVar2) {
          local_3d = IsCord(local_18);
        }
        field_local._4_4_ = 0x18;
        if (local_3d != false) {
          field_local._4_4_ = 0x10;
        }
      }
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(local_18);
      switch(CVar2) {
      case CPPTYPE_INT32:
      case CPPTYPE_UINT32:
      case CPPTYPE_FLOAT:
      case CPPTYPE_ENUM:
        field_local._4_4_ = 4;
        break;
      case CPPTYPE_INT64:
      case CPPTYPE_UINT64:
      case CPPTYPE_DOUBLE:
      case CPPTYPE_MESSAGE:
        field_local._4_4_ = 8;
        break;
      case CPPTYPE_BOOL:
        field_local._4_4_ = 1;
        break;
      case CPPTYPE_STRING:
        bVar1 = IsCord(local_18);
        if (bVar1) {
          field_local._4_4_ = 0x10;
        }
        else {
          field_local._4_4_ = 8;
        }
        break;
      default:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                   ,0x282);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_30);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [16])"Can\'t get here.");
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
      }
    }
  }
  return field_local._4_4_;
}

Assistant:

int EstimateSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      return sizeof(google::protobuf::Map<int32_t, int32_t>);
    }
    return field->cpp_type() < FieldDescriptor::CPPTYPE_STRING || IsCord(field)
               ? sizeof(RepeatedField<int32_t>)
               : sizeof(internal::RepeatedPtrFieldBase);
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;

    case FieldDescriptor::CPPTYPE_STRING:
      if (IsCord(field)) return sizeof(absl::Cord);
      return sizeof(internal::ArenaStringPtr);
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}